

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O3

WW<135UL> * __thiscall GF2::WW<135UL>::Permute(WW<135UL> *this,size_t *pi)

{
  ulong uVar1;
  size_t pos;
  ulong uVar2;
  ulong uVar3;
  WW<135UL> temp;
  
  temp._words[0] = 0;
  temp._words[1] = 0;
  temp._words[2] = 0;
  uVar2 = 0;
  do {
    uVar1 = pi[uVar2];
    if (uVar1 == 0xffffffffffffffff) {
      uVar3 = 1L << ((byte)uVar2 & 0x3f);
LAB_0012370f:
      temp._words[uVar2 >> 6] = temp._words[uVar2 >> 6] & ~uVar3;
    }
    else {
      uVar3 = 1L << ((byte)uVar2 & 0x3f);
      if ((this->_words[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) goto LAB_0012370f;
      temp._words[uVar2 >> 6] = temp._words[uVar2 >> 6] | uVar3;
    }
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x87) {
      this->_words[2] = temp._words[2];
      this->_words[0] = temp._words[0];
      this->_words[1] = temp._words[1];
      return this;
    }
  } while( true );
}

Assistant:

WW& Permute(const size_t pi[_n])
	{	
		WW<_n> temp;
		for (size_t pos = 0; pos < _n; ++pos)
			temp.Set(pos, pi[pos] == SIZE_MAX ? 0 : Test(pi[pos]));
		return operator=(temp);
	}